

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.cpp
# Opt level: O0

void __thiscall
cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
          (ElementsConfidentialAddress *this,ElementsConfidentialAddress *object)

{
  ElementsConfidentialAddress *object_local;
  ElementsConfidentialAddress *this_local;
  
  core::Address::Address(&this->unblinded_address_);
  Pubkey::Pubkey(&this->confidential_key_);
  ::std::__cxx11::string::string((string *)&this->address_);
  core::Address::operator=(&this->unblinded_address_,&object->unblinded_address_);
  Pubkey::operator=(&this->confidential_key_,&object->confidential_key_);
  ::std::__cxx11::string::operator=((string *)&this->address_,(string *)&object->address_);
  return;
}

Assistant:

ElementsConfidentialAddress::ElementsConfidentialAddress(
    const ElementsConfidentialAddress& object) {
  unblinded_address_ = object.unblinded_address_;
  confidential_key_ = object.confidential_key_;
  address_ = object.address_;
}